

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_parse_cookies(http_s *h,uint8_t is_url_encoded)

{
  size_t sVar1;
  uint64_t uVar2;
  FIOBJ FVar3;
  FIOBJ FVar4;
  FIOBJ FVar5;
  size_t i;
  size_t sVar6;
  
  if (h->headers != 0) {
    if ((h->cookies != 0) && (sVar1 = fiobj_hash_count(h->cookies), sVar1 != 0)) {
      if (FIO_LOG_LEVEL < 3) {
        return;
      }
      FIO_LOG2STDERR("WARNING: (http) attempting to parse cookies more than once.");
      return;
    }
    if (http_parse_cookies::setcookie_header_hash == 0) {
      http_parse_cookies::setcookie_header_hash = fiobj_obj2hash(HTTP_HEADER_SET_COOKIE);
    }
    FVar3 = h->headers;
    uVar2 = fiobj_obj2hash(HTTP_HEADER_COOKIE);
    FVar3 = fiobj_hash_get2(FVar3,uVar2);
    if (FVar3 != 0) {
      FVar4 = h->cookies;
      if (FVar4 == 0) {
        FVar4 = fiobj_hash_new();
        h->cookies = FVar4;
      }
      sVar1 = fiobj_type_is(FVar3,FIOBJ_T_ARRAY);
      if (sVar1 == 0) {
        http_parse_cookies_cookie_str(FVar4,FVar3,is_url_encoded);
      }
      else {
        sVar1 = fiobj_ary_count(FVar3);
        for (sVar6 = 0; sVar1 != sVar6; sVar6 = sVar6 + 1) {
          FVar4 = h->cookies;
          FVar5 = fiobj_ary_index(FVar3,sVar6);
          http_parse_cookies_cookie_str(FVar4,FVar5,is_url_encoded);
        }
      }
    }
    FVar3 = h->headers;
    uVar2 = fiobj_obj2hash(HTTP_HEADER_SET_COOKIE);
    FVar3 = fiobj_hash_get2(FVar3,uVar2);
    if (FVar3 != 0) {
      FVar4 = h->cookies;
      if (FVar4 == 0) {
        FVar4 = fiobj_hash_new();
        h->cookies = FVar4;
      }
      sVar1 = fiobj_type_is(FVar3,FIOBJ_T_ARRAY);
      if (sVar1 == 0) {
        http_parse_cookies_setcookie_str(FVar4,FVar3,is_url_encoded);
        return;
      }
      sVar1 = fiobj_ary_count(FVar3);
      for (sVar6 = 0; sVar1 != sVar6; sVar6 = sVar6 + 1) {
        FVar4 = h->cookies;
        FVar5 = fiobj_ary_index(FVar3,sVar6);
        http_parse_cookies_setcookie_str(FVar4,FVar5,is_url_encoded);
      }
    }
  }
  return;
}

Assistant:

void http_parse_cookies(http_s *h, uint8_t is_url_encoded) {
  if (!h->headers)
    return;
  if (h->cookies && fiobj_hash_count(h->cookies)) {
    FIO_LOG_WARNING("(http) attempting to parse cookies more than once.");
    return;
  }
  static uint64_t setcookie_header_hash;
  if (!setcookie_header_hash)
    setcookie_header_hash = fiobj_obj2hash(HTTP_HEADER_SET_COOKIE);
  FIOBJ c = fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_COOKIE));
  if (c) {
    if (!h->cookies)
      h->cookies = fiobj_hash_new();
    if (FIOBJ_TYPE_IS(c, FIOBJ_T_ARRAY)) {
      /* Array of Strings */
      size_t count = fiobj_ary_count(c);
      for (size_t i = 0; i < count; ++i) {
        http_parse_cookies_cookie_str(
            h->cookies, fiobj_ary_index(c, (int64_t)i), is_url_encoded);
      }
    } else {
      /* single string */
      http_parse_cookies_cookie_str(h->cookies, c, is_url_encoded);
    }
  }
  c = fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_SET_COOKIE));
  if (c) {
    if (!h->cookies)
      h->cookies = fiobj_hash_new();
    if (FIOBJ_TYPE_IS(c, FIOBJ_T_ARRAY)) {
      /* Array of Strings */
      size_t count = fiobj_ary_count(c);
      for (size_t i = 0; i < count; ++i) {
        http_parse_cookies_setcookie_str(
            h->cookies, fiobj_ary_index(c, (int64_t)i), is_url_encoded);
      }
    } else {
      /* single string */
      http_parse_cookies_setcookie_str(h->cookies, c, is_url_encoded);
    }
  }
}